

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cc
# Opt level: O3

string * __thiscall
onmt::Tokenizer::detokenize_abi_cxx11_
          (string *__return_storage_ptr__,Tokenizer *this,
          vector<onmt::Token,_std::allocator<onmt::Token>_> *tokens,Ranges *ranges,bool merge_ranges
          ,vector<unsigned_long,_std::allocator<unsigned_long>_> *index_map)

{
  Token *this_00;
  pointer pcVar1;
  pointer puVar2;
  iterator iVar3;
  size_type sVar4;
  _Alloc_hider _Var5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  pointer pTVar9;
  ulong uVar10;
  unsigned_long *puVar11;
  unsigned_long **ppuVar12;
  long lVar13;
  _Base_ptr p_Var14;
  undefined8 uVar15;
  code_point_t uc;
  iterator __begin2;
  string *psVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  undefined7 in_register_00000081;
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>>
  *this_01;
  int end;
  int start;
  vector<unsigned_long,_std::allocator<unsigned_long>_> current_token;
  string prep_word;
  string bridge;
  string c;
  size_t id;
  string code;
  int local_1e0;
  int local_1dc;
  unsigned_long *local_1d8;
  iterator iStack_1d0;
  unsigned_long *local_1c8;
  string local_1b8;
  string *local_198;
  string local_190;
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>>
  *local_170;
  Tokenizer *local_168;
  _Base_ptr local_160;
  undefined1 local_158 [32];
  _Base_ptr p_Stack_138;
  size_t local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  _Head_base<0UL,_unsigned_long_&,_false> local_118;
  unsigned_long local_110;
  undefined4 local_104;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_100;
  string *local_f8;
  undefined1 local_f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  _Alloc_hider local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_104 = (undefined4)CONCAT71(in_register_00000081,merge_ranges);
  paVar17 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar17;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_198 = __return_storage_ptr__;
  local_170 = (_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>>
               *)ranges;
  local_168 = this;
  local_100 = index_map;
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  local_1d8 = (unsigned_long *)0x0;
  pTVar9 = (tokens->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_160 = (_Base_ptr)tokens;
  if ((tokens->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
      super__Vector_impl_data._M_finish != pTVar9) {
    local_f8 = &(local_168->_options).lang;
    do {
      this_00 = pTVar9 + (long)local_1d8;
      if ((((local_1d8 != (unsigned_long *)0x0) && ((local_168->_options).with_separators == false))
          && (this_00[-1].join_right == false)) && (this_00->join_left == false)) {
        std::__cxx11::string::push_back((char)local_198);
      }
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      pcVar1 = (this_00->surface)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b8,pcVar1,pcVar1 + (this_00->surface)._M_string_length);
      bVar6 = Token::is_placeholder(this_00);
      if (!bVar6) {
        if (Lowercase < this_00->casing) {
          restore_token_casing((string *)local_f0,&local_1b8,this_00->casing,local_f8);
          std::__cxx11::string::operator=((string *)&local_1b8,(string *)local_f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._0_8_ != &local_e0) {
            operator_delete((void *)local_f0._0_8_,local_e0._M_allocated_capacity + 1);
          }
        }
        for (uVar10 = std::__cxx11::string::find
                                ((char *)&local_1b8,escaped_character_prefix_abi_cxx11_,0);
            (uVar10 != 0xffffffffffffffff &&
            (DAT_003835f0 + uVar10 + 4 <= local_1b8._M_string_length));
            uVar10 = std::__cxx11::string::find
                               ((char *)&local_1b8,escaped_character_prefix_abi_cxx11_,
                                lVar13 + uVar10)) {
          iVar8 = 4;
          std::__cxx11::string::substr((ulong)local_f0,(ulong)&local_1b8);
          uVar7 = hex_to_int((string *)local_f0);
          unicode::cp_to_utf8_abi_cxx11_((string *)local_158,(unicode *)(ulong)uVar7,uc);
          lVar13 = DAT_003835f0;
          if ((CONCAT44(local_158._12_4_,local_158._8_4_) != 0) &&
             (*(char *)local_158._0_8_ != '\0')) {
            int_to_hex_abi_cxx11_(&local_190,(onmt *)(ulong)uVar7,4,iVar8);
            _Var5._M_p = local_190._M_dataplus._M_p;
            if (local_190._M_string_length == local_f0._8_8_) {
              if ((string *)local_190._M_string_length == (string *)0x0) {
                bVar6 = false;
              }
              else {
                iVar8 = bcmp(local_190._M_dataplus._M_p,(void *)local_f0._0_8_,
                             local_190._M_string_length);
                bVar6 = iVar8 != 0;
              }
            }
            else {
              bVar6 = true;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var5._M_p != &local_190.field_2) {
              operator_delete(_Var5._M_p,
                              CONCAT71(local_190.field_2._M_allocated_capacity._1_7_,
                                       local_190.field_2._M_local_buf[0]) + 1);
            }
            lVar13 = DAT_003835f0;
            if (!bVar6) {
              std::__cxx11::string::replace
                        ((ulong)&local_1b8,uVar10,(char *)(DAT_003835f0 + 4),local_158._0_8_);
              lVar13 = 1;
            }
          }
          if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
            operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._0_8_ != &local_e0) {
            operator_delete((void *)local_f0._0_8_,local_e0._M_allocated_capacity + 1);
          }
        }
      }
      if (local_1b8._M_string_length != 0) {
        if (local_170 !=
            (_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>>
             *)0x0) {
          ppuVar12 = &local_1d8;
          if (local_100 != (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
            puVar2 = (local_100->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            puVar11 = (unsigned_long *)
                      ((long)(local_100->
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3);
            if (puVar11 <= local_1d8) {
              uVar15 = std::__throw_out_of_range_fmt
                                 ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                  ,local_1d8,puVar11);
              if (local_1b8._M_dataplus._M_p != local_158 + 0x10) {
                operator_delete(local_1b8._M_dataplus._M_p,
                                local_1b8.field_2._M_allocated_capacity + 1);
              }
              if ((ulong *)local_190._M_dataplus._M_p != &escaped_character_prefix_abi_cxx11_) {
                operator_delete(local_190._M_dataplus._M_p,
                                CONCAT71(local_190.field_2._M_allocated_capacity._1_7_,
                                         local_190.field_2._M_local_buf[0]) + 1);
              }
              pcVar1 = (local_198->_M_dataplus)._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar1 != paVar17) {
                operator_delete(pcVar1,paVar17->_M_allocated_capacity + 1);
              }
              _Unwind_Resume(uVar15);
            }
            ppuVar12 = (unsigned_long **)(puVar2 + (long)local_1d8);
          }
          local_190._M_dataplus._M_p = (pointer)local_198->_M_string_length;
          local_128._M_allocated_capacity =
               (size_type)(local_190._M_dataplus._M_p + local_1b8._M_string_length + -1);
          local_f0._0_8_ = &local_128;
          local_f0._8_8_ = &local_190;
          local_158._0_8_ = ppuVar12;
          std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>>
          ::
          _M_emplace_unique<std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<unsigned_long&&,unsigned_long&&>>
                    (local_170,(piecewise_construct_t *)&std::piecewise_construct,
                     (tuple<const_unsigned_long_&> *)local_158,
                     (tuple<unsigned_long_&&,_unsigned_long_&&> *)local_f0);
        }
        std::__cxx11::string::_M_append((char *)local_198,(ulong)local_1b8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      local_1d8 = (unsigned_long *)((long)local_1d8 + 1);
      pTVar9 = (((_Vector_base<onmt::Token,_std::allocator<onmt::Token>_> *)&local_160->_M_color)->
               _M_impl).super__Vector_impl_data._M_start;
    } while (local_1d8 <
             (unsigned_long *)
             (((long)(((_Vector_base<onmt::Token,_std::allocator<onmt::Token>_> *)
                      &local_160->_M_color)->_M_impl).super__Vector_impl_data._M_finish -
               (long)pTVar9 >> 3) * -0x71c71c71c71c71c7));
  }
  this_01 = local_170;
  if (((byte)local_104 &
      local_170 !=
      (_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>>
       *)0x0) != 0) {
    paVar17 = &local_190.field_2;
    local_190._M_string_length = 0;
    local_190.field_2._M_local_buf[0] = '\0';
    local_1b8._M_string_length = 0;
    local_1b8.field_2._M_allocated_capacity =
         local_1b8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    local_190._M_dataplus._M_p = (pointer)paVar17;
    Tokenizer((Tokenizer *)local_f0,Conservative,0,&local_190,(string *)&joiner_marker_abi_cxx11_,
              &local_1b8,0x32);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != paVar17) {
      operator_delete(local_190._M_dataplus._M_p,
                      CONCAT71(local_190.field_2._M_allocated_capacity._1_7_,
                               local_190.field_2._M_local_buf[0]) + 1);
    }
    local_1b8.field_2._M_allocated_capacity = 0;
    local_1b8._M_dataplus._M_p = (pointer)0x0;
    local_1b8._M_string_length = 0;
    local_190._M_string_length = 0;
    local_190.field_2._M_local_buf[0] = '\0';
    local_158._24_8_ = local_158 + 8;
    local_158._8_4_ = _S_red;
    local_158._16_8_ = (_Base_ptr)0x0;
    local_130 = 0;
    local_1c8 = (unsigned_long *)0x0;
    local_1d8 = (unsigned_long *)0x0;
    iStack_1d0._M_current = (unsigned_long *)0x0;
    local_1dc = 0;
    local_1e0 = -1;
    p_Var14 = *(_Base_ptr *)(this_01 + 0x18);
    local_160 = (_Base_ptr)(this_01 + 8);
    local_190._M_dataplus._M_p = (pointer)paVar17;
    p_Stack_138 = (_Base_ptr)local_158._24_8_;
    if (p_Var14 != local_160) {
      do {
        if (local_1e0 + 1 == (int)p_Var14[1]._M_parent) {
          if (p_Var14 != *(_Base_ptr *)(local_170 + 0x18)) {
            lVar13 = std::_Rb_tree_decrement(p_Var14);
            std::__cxx11::string::assign
                      ((string *)&local_190,(ulong)local_198,*(ulong *)(lVar13 + 0x28));
            sVar4 = local_1b8._M_string_length;
            if ((pointer)local_1b8._M_string_length != local_1b8._M_dataplus._M_p) {
              local_168 = (Tokenizer *)local_1b8._M_dataplus._M_p;
              psVar16 = (string *)(local_1b8._M_dataplus._M_p + 0x10);
              do {
                if (psVar16 != (string *)*(undefined1 **)((long)(psVar16 + -1) + 0x10)) {
                  operator_delete(*(undefined1 **)((long)(psVar16 + -1) + 0x10),
                                  (ulong)((psVar16->_M_dataplus)._M_p + 1));
                }
                paVar17 = &psVar16->field_2;
                psVar16 = psVar16 + 1;
              } while (paVar17 !=
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)sVar4);
              local_1b8._M_string_length = (size_type)local_168;
            }
            ITokenizer::tokenize
                      ((ITokenizer *)local_f0,&local_190,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_1b8,true);
            if (0x20 < local_1b8._M_string_length - (long)local_1b8._M_dataplus._M_p)
            goto LAB_001b2c91;
          }
        }
        else {
LAB_001b2c91:
          iVar3._M_current = iStack_1d0._M_current;
          puVar11 = local_1d8;
          if (local_1d8 != iStack_1d0._M_current) {
            do {
              local_110 = *puVar11;
              local_118._M_head_impl = &local_110;
              local_128._M_allocated_capacity = (size_type)&local_1e0;
              local_128._8_8_ = &local_1dc;
              std::
              _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>>
              ::
              _M_emplace_unique<std::piecewise_construct_t_const&,std::tuple<unsigned_long&>,std::tuple<int&,int&>>
                        ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>>
                          *)local_158,(piecewise_construct_t *)&std::piecewise_construct,
                         (tuple<unsigned_long_&> *)&local_118,(tuple<int_&,_int_&> *)&local_128);
              puVar11 = puVar11 + 1;
            } while (puVar11 != iVar3._M_current);
            if (iStack_1d0._M_current != local_1d8) {
              iStack_1d0._M_current = local_1d8;
            }
          }
          local_1dc = *(int *)&p_Var14[1]._M_parent;
        }
        local_1e0 = *(int *)&p_Var14[1]._M_left;
        if (iStack_1d0._M_current == local_1c8) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_1d8,iStack_1d0,
                     (unsigned_long *)(p_Var14 + 1));
        }
        else {
          *iStack_1d0._M_current = *(unsigned_long *)(p_Var14 + 1);
          iStack_1d0._M_current = iStack_1d0._M_current + 1;
        }
        p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
        iVar3._M_current = iStack_1d0._M_current;
      } while (p_Var14 != local_160);
      if (local_1d8 != iStack_1d0._M_current) {
        puVar11 = local_1d8;
        do {
          local_110 = *puVar11;
          local_118._M_head_impl = &local_110;
          local_128._M_allocated_capacity = (size_type)&local_1e0;
          local_128._8_8_ = &local_1dc;
          std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>>
          ::
          _M_emplace_unique<std::piecewise_construct_t_const&,std::tuple<unsigned_long&>,std::tuple<int&,int&>>
                    ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>>
                      *)local_158,(piecewise_construct_t *)&std::piecewise_construct,
                     (tuple<unsigned_long_&> *)&local_118,(tuple<int_&,_int_&> *)&local_128);
          puVar11 = puVar11 + 1;
        } while (puVar11 != iVar3._M_current);
      }
      this_01 = local_170;
      if (local_1d8 != (unsigned_long *)0x0) {
        operator_delete(local_1d8,(long)local_1c8 - (long)local_1d8);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,
                      CONCAT71(local_190.field_2._M_allocated_capacity._1_7_,
                               local_190.field_2._M_local_buf[0]) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1b8);
    local_f0._0_8_ = &PTR__Tokenizer_0037c058;
    if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
    }
    std::
    _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_p != &local_a8) {
      operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_allocated_capacity != &local_d0) {
      operator_delete((void *)local_e0._M_allocated_capacity,local_d0._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
    ::clear((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
             *)this_01);
    if ((_Base_ptr)local_158._16_8_ != (_Base_ptr)0x0) {
      *(undefined4 *)(this_01 + 8) = local_158._8_4_;
      *(undefined8 *)(this_01 + 0x10) = local_158._16_8_;
      *(undefined8 *)(this_01 + 0x18) = local_158._24_8_;
      *(_Base_ptr *)(this_01 + 0x20) = p_Stack_138;
      *(_Base_ptr *)(local_158._16_8_ + 8) = local_160;
      *(size_t *)(this_01 + 0x28) = local_130;
      local_158._16_8_ = (_Base_ptr)0x0;
      local_130 = 0;
      local_158._24_8_ = (_Base_ptr)(local_158 + 8);
      p_Stack_138 = (_Base_ptr)(local_158 + 8);
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                 *)local_158);
  }
  return local_198;
}

Assistant:

std::string Tokenizer::detokenize(const std::vector<Token>& tokens,
                                    Ranges* ranges,
                                    bool merge_ranges,
                                    const std::vector<size_t>* index_map) const
  {
    std::string line;
    line.reserve(tokens.size() * 10);

    for (size_t i = 0; i < tokens.size(); ++i)
    {
      const auto& token = tokens[i];
      if (!_options.with_separators && i > 0 && !tokens[i - 1].join_right && !token.join_left)
        line += ' ';

      std::string prep_word = token.surface;

      if (!token.is_placeholder())
      {
        if (token.casing != Casing::None && token.casing != Casing::Lowercase)
          prep_word = restore_token_casing(prep_word, token.casing, _options.lang);
        unescape_characters(prep_word);
      }

      if (!prep_word.empty())
      {
        if (ranges)
          ranges->emplace(std::piecewise_construct,
                          std::forward_as_tuple(index_map ? index_map->at(i) : i),
                          std::forward_as_tuple(line.size(), line.size() + prep_word.size() - 1));

        line.append(prep_word);
      }
    }

    if (ranges && merge_ranges)
      *ranges = merge_consecutive_ranges(line, *ranges);

    return line;
  }